

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O1

int ec_bits(EVP_PKEY *pkey)

{
  int iVar1;
  EC_GROUP *group;
  
  group = (EC_GROUP *)EC_KEY_get0_group((EC_KEY *)pkey->pkey);
  if (group != (EC_GROUP *)0x0) {
    iVar1 = EC_GROUP_order_bits(group);
    return iVar1;
  }
  ERR_clear_error();
  return 0;
}

Assistant:

static int ec_bits(const EVP_PKEY *pkey) {
  const EC_KEY *ec_key = reinterpret_cast<const EC_KEY *>(pkey->pkey);
  const EC_GROUP *group = EC_KEY_get0_group(ec_key);
  if (group == NULL) {
    ERR_clear_error();
    return 0;
  }
  return EC_GROUP_order_bits(group);
}